

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

float Abc_SclCountNonBufferLoad(SC_Man *p,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  SC_Pair *pSVar2;
  float fVar3;
  int local_28;
  float local_24;
  int i;
  float Load;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  local_24 = 0.0;
  for (local_28 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_28 < iVar1; local_28 = local_28 + 1) {
    pObj_00 = Abc_ObjFanout(pObj,local_28);
    fVar3 = Abc_SclCountNonBufferLoadInt(p,pObj_00);
    local_24 = fVar3 + local_24;
  }
  pSVar2 = Abc_SclObjLoad(p,pObj);
  fVar3 = pSVar2->rise;
  pSVar2 = Abc_SclObjLoad(p,pObj);
  return local_24 + fVar3 * 0.5 + pSVar2->fall * 0.5;
}

Assistant:

float Abc_SclCountNonBufferLoad( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Load = 0;
    int i; 
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Load += Abc_SclCountNonBufferLoadInt( p, pFanout );
    Load += 0.5 * Abc_SclObjLoad(p, pObj)->rise + 0.5 * Abc_SclObjLoad(p, pObj)->fall;
    return Load;
}